

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O0

char * token_pos(Token *token)

{
  CharBuff *buff_00;
  char *pcVar1;
  char *s;
  CharBuff *buff;
  Token *token_local;
  
  buff_00 = new_buff(4);
  append_chr(buff_00,'(');
  pcVar1 = itochr(token->row_pos);
  append_str(buff_00,pcVar1);
  append_chr(buff_00,',');
  pcVar1 = itochr(token->col_pos);
  append_str(buff_00,pcVar1);
  append_chr(buff_00,')');
  append_chr(buff_00,'\0');
  pcVar1 = to_string(buff_00);
  free(buff_00->body);
  free(buff_00);
  return pcVar1;
}

Assistant:

char *token_pos(Token *token) {
    CharBuff *buff = new_buff(4);
    append_chr(buff, '(');
    append_str(buff, itochr((int) token->row_pos));
    append_chr(buff, ',');
    append_str(buff, itochr((int) token->col_pos));
    append_chr(buff, ')');
    append_chr(buff, '\0');
    char *s = to_string(buff);
    free(buff->body);
    free(buff);
    return s;
}